

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O1

void nrn_list(Item *q1,Item *q2)

{
  short *psVar1;
  char *__s1;
  Item *pIVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  List *pLVar6;
  Item *pIVar7;
  List **ppLVar8;
  
  bVar3 = true;
  ppLVar8 = (List **)0x0;
  switch(((q1->element).sym)->type) {
  case 0x157:
    mechname = ((q2->element).sym)->name;
    __s1 = ((q1->element).sym)->name;
    iVar4 = strcmp(__s1,"POINT_PROCESS");
    if (iVar4 == 0) {
      piVar5 = &point_process;
LAB_0010a3c7:
      *piVar5 = 1;
    }
    else {
      iVar4 = strcmp(__s1,"ARTIFICIAL_CELL");
      if (iVar4 == 0) {
        point_process = 1;
        piVar5 = &artificial_cell;
        goto LAB_0010a3c7;
      }
    }
    set_suffix();
    break;
  case 0x158:
    goto switchD_0010a21a_caseD_158;
  default:
    goto switchD_0010a21a_caseD_159;
  case 0x15e:
    pIVar2 = q2->next;
    pIVar7 = q1->next;
    if (pIVar7 != pIVar2) {
      ppLVar8 = (List **)0x0;
      do {
        psVar1 = &((pIVar7->element).sym)->nrntype;
        *psVar1 = *psVar1 | 0x140;
        pIVar7 = pIVar7->next;
      } while (pIVar7 != pIVar2);
      goto switchD_0010a21a_caseD_159;
    }
    break;
  case 0x15f:
    diag("NEURON SECTION variables not implemented",(char *)0x0);
  case 0x160:
    pIVar2 = q2->next;
    pIVar7 = q1->next;
    if (pIVar7 != pIVar2) {
      ppLVar8 = (List **)0x0;
      do {
        psVar1 = &((pIVar7->element).sym)->nrntype;
        *psVar1 = *psVar1 | 8;
        pIVar7 = pIVar7->next;
      } while (pIVar7 != pIVar2);
      goto switchD_0010a21a_caseD_159;
    }
    break;
  case 0x161:
    bVar3 = false;
    threadsafe("Use of POINTER is not thread safe.");
    pIVar2 = q2->next;
    pIVar7 = q1->next;
    ppLVar8 = &nrnpointers;
    if (pIVar7 == pIVar2) goto switchD_0010a21a_caseD_159;
    do {
      psVar1 = &((pIVar7->element).sym)->nrntype;
      *psVar1 = *psVar1 | 0x900;
      pIVar7 = pIVar7->next;
    } while (pIVar7 != pIVar2);
    goto LAB_0010a315;
  case 0x162:
    threadsafe("Use of BBCOREPOINTER is not thread safe.");
    pIVar2 = q2->next;
    for (pIVar7 = q1->next; pIVar7 != pIVar2; pIVar7 = pIVar7->next) {
      psVar1 = &((pIVar7->element).sym)->nrntype;
      *psVar1 = *psVar1 | 0x2100;
    }
    use_bbcorepointer = 1;
    ppLVar8 = &nrnpointers;
    goto LAB_0010a315;
  case 0x163:
    ppLVar8 = (List **)0x0;
    threadsafe("Use of EXTERNAL is not thread safe.");
    pIVar2 = q2->next;
    pIVar7 = q1->next;
    if (pIVar7 != pIVar2) {
      ppLVar8 = (List **)0x0;
      do {
        psVar1 = &((pIVar7->element).sym)->nrntype;
        *psVar1 = *psVar1 | 0x101;
        pIVar7 = pIVar7->next;
      } while (pIVar7 != pIVar2);
    }
    goto switchD_0010a21a_caseD_159;
  case 0x167:
    electrode_current = 1;
    goto switchD_0010a21a_caseD_158;
  }
  ppLVar8 = (List **)0x0;
switchD_0010a21a_caseD_159:
  if (bVar3) {
    return;
  }
  if (*ppLVar8 == (List *)0x0) {
    pLVar6 = newlist();
    *ppLVar8 = pLVar6;
  }
  if (q1 != q2) {
    movelist(q1->next,q2,*ppLVar8);
    return;
  }
  __assert_fail("q1 != q2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                ,0x7d8,"void nrn_list()");
switchD_0010a21a_caseD_158:
  pIVar2 = q2->next;
  ppLVar8 = &currents;
  for (pIVar7 = q1->next; pIVar7 != pIVar2; pIVar7 = pIVar7->next) {
    psVar1 = &((pIVar7->element).sym)->nrntype;
    *psVar1 = *psVar1 | 8;
  }
LAB_0010a315:
  bVar3 = false;
  goto switchD_0010a21a_caseD_159;
}

Assistant:

void nrn_list(q1, q2)
	Item *q1, *q2;
{
	List **plist = (List **)0;
	Item *q;
		
	switch (SYM(q1)->type) {
	case RANGE:
		plist = (List **)0;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNRANGE;
		}
		break;
	case SUFFIX:
		plist = (List **)0;
		mechname = SYM(q2)->name;
		if (strcmp(SYM(q1)->name, "POINT_PROCESS") == 0) {
			point_process = 1;
		}else if (strcmp(SYM(q1)->name, "ARTIFICIAL_CELL") == 0) {
			point_process = 1;
			artificial_cell = 1;
		}
		set_suffix();
		break;
	case ELECTRODE_CURRENT:
		electrode_current = 1;
	case NONSPECIFIC:
		plist = &currents;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNRANGE;
		}
		break;
	case SECTION:
		diag("NEURON SECTION variables not implemented", (char *)0);
		break;
	case GLOBAL:
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNGLOBAL | NRNNOTP;
		}
		plist = (List **)0;
		break;
	case EXTERNAL:
#if VECTORIZE
threadsafe("Use of EXTERNAL is not thread safe.");
#endif
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNEXTRN | NRNNOTP;
		}
		plist = (List **)0;
		break;
	case POINTER:
threadsafe("Use of POINTER is not thread safe.");
		plist = &nrnpointers;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNNOTP | NRNPOINTER;
		}
		break;
	case BBCOREPOINTER:
threadsafe("Use of BBCOREPOINTER is not thread safe.");
		plist = &nrnpointers;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNNOTP | NRNBBCOREPOINTER;
		}
		use_bbcorepointer = 1;
		break;
	}
	if (plist) {
		if (!*plist) {
			*plist = newlist();
		}
		assert (q1 != q2);
		movelist(q1->next, q2, *plist);
	}
}